

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_collection.cpp
# Opt level: O2

string * __thiscall
duckdb::TupleDataCollection::ToString_abi_cxx11_
          (string *__return_storage_ptr__,TupleDataCollection *this)

{
  TupleDataCollection *pTVar1;
  bool bVar2;
  string *psVar3;
  unsigned_long in_R8;
  unsigned_long in_R9;
  unsigned_long params;
  allocator local_319;
  string *local_318;
  TupleDataCollection *local_310;
  Exception local_308 [2];
  DataChunk chunk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  string local_268 [32];
  string local_248;
  TupleDataScanState scan_state;
  
  local_318 = __return_storage_ptr__;
  DataChunk::DataChunk(&chunk);
  local_310 = this;
  InitializeChunk(this,&chunk);
  TupleDataScanState::TupleDataScanState(&scan_state);
  InitializeScan(local_310,&scan_state,UNPIN_AFTER_DONE);
  ::std::__cxx11::string::string
            ((string *)local_308,"TupleDataCollection - [%llu Chunks, %llu Rows]\n",
             (allocator *)&local_2a8);
  pTVar1 = local_310;
  psVar3 = (string *)ChunkCount(local_310);
  Exception::ConstructMessage<unsigned_long,unsigned_long>
            (local_318,local_308,psVar3,pTVar1->count,in_R8);
  ::std::__cxx11::string::~string((string *)local_308);
  psVar3 = (string *)0x0;
  params = 0;
  while( true ) {
    bVar2 = Scan(local_310,&scan_state,&chunk);
    if (!bVar2) break;
    ::std::__cxx11::string::string(local_268,"Chunk %llu - [Rows %llu - %llu]\n",&local_319);
    Exception::ConstructMessage<unsigned_long,unsigned_long,unsigned_long>
              (&local_248,(Exception *)local_268,psVar3,params,chunk.count + params,in_R9);
    DataChunk::ToString_abi_cxx11_(&local_288,&chunk);
    ::std::operator+(&local_2a8,&local_248,&local_288);
    ::std::__cxx11::string::append((string *)local_318);
    ::std::__cxx11::string::~string((string *)&local_2a8);
    ::std::__cxx11::string::~string((string *)&local_288);
    ::std::__cxx11::string::~string((string *)&local_248);
    ::std::__cxx11::string::~string(local_268);
    psVar3 = (string *)((long)&(psVar3->_M_dataplus)._M_p + 1);
    params = params + chunk.count;
  }
  TupleDataScanState::~TupleDataScanState(&scan_state);
  DataChunk::~DataChunk(&chunk);
  return local_318;
}

Assistant:

string TupleDataCollection::ToString() {
	DataChunk chunk;
	InitializeChunk(chunk);

	TupleDataScanState scan_state;
	InitializeScan(scan_state);

	string result = StringUtil::Format("TupleDataCollection - [%llu Chunks, %llu Rows]\n", ChunkCount(), Count());
	idx_t chunk_idx = 0;
	idx_t row_count = 0;
	while (Scan(scan_state, chunk)) {
		result +=
		    StringUtil::Format("Chunk %llu - [Rows %llu - %llu]\n", chunk_idx, row_count, row_count + chunk.size()) +
		    chunk.ToString();
		chunk_idx++;
		row_count += chunk.size();
	}

	return result;
}